

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# 7zCrc.c
# Opt level: O0

void CrcGenerateTable(void)

{
  Bool_conflict BVar1;
  UInt32 r_1;
  uint j;
  UInt32 r;
  UInt32 i;
  uint local_c;
  uint local_8;
  uint local_4;
  
  for (local_4 = 0; local_4 < 0x100; local_4 = local_4 + 1) {
    local_8 = local_4;
    for (local_c = 0; local_c < 8; local_c = local_c + 1) {
      local_8 = local_8 >> 1 ^ ((local_8 & 1) - 1 ^ 0xffffffff) & 0xedb88320;
    }
    g_CrcTable[local_4] = local_8;
  }
  for (; local_4 < 0x800; local_4 = local_4 + 1) {
    g_CrcTable[local_4] =
         g_CrcTable[g_CrcTable[local_4 - 0x100] & 0xff] ^ g_CrcTable[local_4 - 0x100] >> 8;
  }
  g_CrcUpdateT4 = CrcUpdateT4;
  g_CrcUpdate = CrcUpdateT4;
  g_CrcUpdateT8 = CrcUpdateT8;
  BVar1 = CPU_Is_InOrder();
  if (BVar1 == 0) {
    g_CrcUpdate = CrcUpdateT8;
  }
  return;
}

Assistant:

void MY_FAST_CALL CrcGenerateTable()
{
  UInt32 i;
  for (i = 0; i < 256; i++)
  {
    UInt32 r = i;
    unsigned j;
    for (j = 0; j < 8; j++)
      r = (r >> 1) ^ (kCrcPoly & ~((r & 1) - 1));
    g_CrcTable[i] = r;
  }
  for (; i < 256 * CRC_NUM_TABLES; i++)
  {
    UInt32 r = g_CrcTable[i - 256];
    g_CrcTable[i] = g_CrcTable[r & 0xFF] ^ (r >> 8);
  }

  #if CRC_NUM_TABLES < 4
  
  g_CrcUpdate = CrcUpdateT1;
  
  #else
 
  #ifdef MY_CPU_LE

    g_CrcUpdateT4 = CrcUpdateT4;
    g_CrcUpdate = CrcUpdateT4;

    #if CRC_NUM_TABLES >= 8
      g_CrcUpdateT8 = CrcUpdateT8;
  
      #ifdef MY_CPU_X86_OR_AMD64
      if (!CPU_Is_InOrder())
        g_CrcUpdate = CrcUpdateT8;
      #endif
    #endif

  #else
  {
    #ifndef MY_CPU_BE
    UInt32 k = 0x01020304;
    const Byte *p = (const Byte *)&k;
    if (p[0] == 4 && p[1] == 3)
    {
      g_CrcUpdateT4 = CrcUpdateT4;
      g_CrcUpdate = CrcUpdateT4;
      #if CRC_NUM_TABLES >= 8
      g_CrcUpdateT8 = CrcUpdateT8;
      // g_CrcUpdate = CrcUpdateT8;
      #endif
    }
    else if (p[0] != 1 || p[1] != 2)
      g_CrcUpdate = CrcUpdateT1;
    else
    #endif
    {
      for (i = 256 * CRC_NUM_TABLES - 1; i >= 256; i--)
      {
        UInt32 x = g_CrcTable[i - 256];
        g_CrcTable[i] = CRC_UINT32_SWAP(x);
      }
      g_CrcUpdateT4 = CrcUpdateT1_BeT4;
      g_CrcUpdate = CrcUpdateT1_BeT4;
      #if CRC_NUM_TABLES >= 8
      g_CrcUpdateT8 = CrcUpdateT1_BeT8;
      // g_CrcUpdate = CrcUpdateT1_BeT8;
      #endif
    }
  }
  #endif

  #endif
}